

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O0

void __thiscall Catch::ReporterRegistry::ReporterRegistry(ReporterRegistry *this)

{
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::Detail::unique_ptr<Catch::IReporterFactory>,_Catch::Detail::CaseInsensitiveLess,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::Detail::unique_ptr<Catch::IReporterFactory>_>_>_>
  *this_00;
  ReporterRegistryImpl *pRVar1;
  allocator<char> *__a;
  mapped_type *this_01;
  unique_ptr<Catch::ReporterRegistry::ReporterRegistryImpl> *in_RDI;
  unique_ptr<Catch::ReporterFactory<Catch::JsonReporter>_> *in_stack_fffffffffffffd48;
  unique_ptr<Catch::IReporterFactory> *in_stack_fffffffffffffd50;
  allocator<char> *in_stack_fffffffffffffd80;
  char *in_stack_fffffffffffffd88;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::Detail::unique_ptr<Catch::IReporterFactory>,_Catch::Detail::CaseInsensitiveLess,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::Detail::unique_ptr<Catch::IReporterFactory>_>_>_>
  *__s;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_02;
  key_type *in_stack_fffffffffffffda8;
  key_type *__k;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::Detail::unique_ptr<Catch::IReporterFactory>,_Catch::Detail::CaseInsensitiveLess,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::Detail::unique_ptr<Catch::IReporterFactory>_>_>_>
  *in_stack_fffffffffffffdb0;
  allocator<char> local_1c1;
  string local_1c0 [47];
  allocator<char> local_191;
  string local_190 [47];
  undefined1 local_161 [48];
  undefined1 local_131 [48];
  allocator<char> local_101;
  string local_100 [47];
  allocator<char> local_d1;
  string local_d0 [47];
  allocator<char> local_a1;
  string local_a0 [47];
  allocator<char> local_71;
  string local_70 [47];
  allocator<char> local_41;
  string local_40 [64];
  
  Detail::make_unique<Catch::ReporterRegistry::ReporterRegistryImpl>();
  Detail::make_unique<Catch::ReporterFactory<Catch::AutomakeReporter>>();
  Detail::unique_ptr<Catch::ReporterRegistry::ReporterRegistryImpl>::operator->(in_RDI);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffd90,in_stack_fffffffffffffd88,in_stack_fffffffffffffd80);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::Detail::unique_ptr<Catch::IReporterFactory>,_Catch::Detail::CaseInsensitiveLess,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::Detail::unique_ptr<Catch::IReporterFactory>_>_>_>
  ::operator[](in_stack_fffffffffffffdb0,in_stack_fffffffffffffda8);
  Detail::unique_ptr<Catch::IReporterFactory>::operator=
            (in_stack_fffffffffffffd50,
             (unique_ptr<Catch::ReporterFactory<Catch::AutomakeReporter>_> *)
             in_stack_fffffffffffffd48);
  std::__cxx11::string::~string(local_40);
  std::allocator<char>::~allocator(&local_41);
  Detail::unique_ptr<Catch::ReporterFactory<Catch::AutomakeReporter>_>::~unique_ptr
            ((unique_ptr<Catch::ReporterFactory<Catch::AutomakeReporter>_> *)
             in_stack_fffffffffffffd50);
  Detail::make_unique<Catch::ReporterFactory<Catch::CompactReporter>>();
  Detail::unique_ptr<Catch::ReporterRegistry::ReporterRegistryImpl>::operator->(in_RDI);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffd90,in_stack_fffffffffffffd88,in_stack_fffffffffffffd80);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::Detail::unique_ptr<Catch::IReporterFactory>,_Catch::Detail::CaseInsensitiveLess,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::Detail::unique_ptr<Catch::IReporterFactory>_>_>_>
  ::operator[](in_stack_fffffffffffffdb0,in_stack_fffffffffffffda8);
  Detail::unique_ptr<Catch::IReporterFactory>::operator=
            (in_stack_fffffffffffffd50,
             (unique_ptr<Catch::ReporterFactory<Catch::CompactReporter>_> *)
             in_stack_fffffffffffffd48);
  std::__cxx11::string::~string(local_70);
  std::allocator<char>::~allocator(&local_71);
  Detail::unique_ptr<Catch::ReporterFactory<Catch::CompactReporter>_>::~unique_ptr
            ((unique_ptr<Catch::ReporterFactory<Catch::CompactReporter>_> *)
             in_stack_fffffffffffffd50);
  Detail::make_unique<Catch::ReporterFactory<Catch::ConsoleReporter>>();
  Detail::unique_ptr<Catch::ReporterRegistry::ReporterRegistryImpl>::operator->(in_RDI);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffd90,in_stack_fffffffffffffd88,in_stack_fffffffffffffd80);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::Detail::unique_ptr<Catch::IReporterFactory>,_Catch::Detail::CaseInsensitiveLess,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::Detail::unique_ptr<Catch::IReporterFactory>_>_>_>
  ::operator[](in_stack_fffffffffffffdb0,in_stack_fffffffffffffda8);
  Detail::unique_ptr<Catch::IReporterFactory>::operator=
            (in_stack_fffffffffffffd50,
             (unique_ptr<Catch::ReporterFactory<Catch::ConsoleReporter>_> *)
             in_stack_fffffffffffffd48);
  std::__cxx11::string::~string(local_a0);
  std::allocator<char>::~allocator(&local_a1);
  Detail::unique_ptr<Catch::ReporterFactory<Catch::ConsoleReporter>_>::~unique_ptr
            ((unique_ptr<Catch::ReporterFactory<Catch::ConsoleReporter>_> *)
             in_stack_fffffffffffffd50);
  Detail::make_unique<Catch::ReporterFactory<Catch::JunitReporter>>();
  Detail::unique_ptr<Catch::ReporterRegistry::ReporterRegistryImpl>::operator->(in_RDI);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffd90,in_stack_fffffffffffffd88,in_stack_fffffffffffffd80);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::Detail::unique_ptr<Catch::IReporterFactory>,_Catch::Detail::CaseInsensitiveLess,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::Detail::unique_ptr<Catch::IReporterFactory>_>_>_>
  ::operator[](in_stack_fffffffffffffdb0,in_stack_fffffffffffffda8);
  Detail::unique_ptr<Catch::IReporterFactory>::operator=
            (in_stack_fffffffffffffd50,
             (unique_ptr<Catch::ReporterFactory<Catch::JunitReporter>_> *)in_stack_fffffffffffffd48)
  ;
  std::__cxx11::string::~string(local_d0);
  std::allocator<char>::~allocator(&local_d1);
  Detail::unique_ptr<Catch::ReporterFactory<Catch::JunitReporter>_>::~unique_ptr
            ((unique_ptr<Catch::ReporterFactory<Catch::JunitReporter>_> *)in_stack_fffffffffffffd50)
  ;
  Detail::make_unique<Catch::ReporterFactory<Catch::SonarQubeReporter>>();
  Detail::unique_ptr<Catch::ReporterRegistry::ReporterRegistryImpl>::operator->(in_RDI);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffd90,in_stack_fffffffffffffd88,in_stack_fffffffffffffd80);
  this_00 = (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::Detail::unique_ptr<Catch::IReporterFactory>,_Catch::Detail::CaseInsensitiveLess,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::Detail::unique_ptr<Catch::IReporterFactory>_>_>_>
             *)std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::Detail::unique_ptr<Catch::IReporterFactory>,_Catch::Detail::CaseInsensitiveLess,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::Detail::unique_ptr<Catch::IReporterFactory>_>_>_>
               ::operator[](in_stack_fffffffffffffdb0,in_stack_fffffffffffffda8);
  Detail::unique_ptr<Catch::IReporterFactory>::operator=
            (in_stack_fffffffffffffd50,
             (unique_ptr<Catch::ReporterFactory<Catch::SonarQubeReporter>_> *)
             in_stack_fffffffffffffd48);
  std::__cxx11::string::~string(local_100);
  std::allocator<char>::~allocator(&local_101);
  Detail::unique_ptr<Catch::ReporterFactory<Catch::SonarQubeReporter>_>::~unique_ptr
            ((unique_ptr<Catch::ReporterFactory<Catch::SonarQubeReporter>_> *)
             in_stack_fffffffffffffd50);
  Detail::make_unique<Catch::ReporterFactory<Catch::TAPReporter>>();
  Detail::unique_ptr<Catch::ReporterRegistry::ReporterRegistryImpl>::operator->(in_RDI);
  __k = (key_type *)local_131;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffd90,in_stack_fffffffffffffd88,in_stack_fffffffffffffd80);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::Detail::unique_ptr<Catch::IReporterFactory>,_Catch::Detail::CaseInsensitiveLess,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::Detail::unique_ptr<Catch::IReporterFactory>_>_>_>
  ::operator[](this_00,__k);
  Detail::unique_ptr<Catch::IReporterFactory>::operator=
            (in_stack_fffffffffffffd50,
             (unique_ptr<Catch::ReporterFactory<Catch::TAPReporter>_> *)in_stack_fffffffffffffd48);
  std::__cxx11::string::~string((string *)(local_131 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_131);
  Detail::unique_ptr<Catch::ReporterFactory<Catch::TAPReporter>_>::~unique_ptr
            ((unique_ptr<Catch::ReporterFactory<Catch::TAPReporter>_> *)in_stack_fffffffffffffd50);
  Detail::make_unique<Catch::ReporterFactory<Catch::TeamCityReporter>>();
  pRVar1 = Detail::unique_ptr<Catch::ReporterRegistry::ReporterRegistryImpl>::operator->(in_RDI);
  __s = &pRVar1->factories;
  this_02 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_161;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(this_02,(char *)__s,in_stack_fffffffffffffd80);
  __a = (allocator<char> *)
        std::
        map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::Detail::unique_ptr<Catch::IReporterFactory>,_Catch::Detail::CaseInsensitiveLess,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::Detail::unique_ptr<Catch::IReporterFactory>_>_>_>
        ::operator[](this_00,__k);
  Detail::unique_ptr<Catch::IReporterFactory>::operator=
            (in_stack_fffffffffffffd50,
             (unique_ptr<Catch::ReporterFactory<Catch::TeamCityReporter>_> *)
             in_stack_fffffffffffffd48);
  std::__cxx11::string::~string((string *)(local_161 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_161);
  Detail::unique_ptr<Catch::ReporterFactory<Catch::TeamCityReporter>_>::~unique_ptr
            ((unique_ptr<Catch::ReporterFactory<Catch::TeamCityReporter>_> *)
             in_stack_fffffffffffffd50);
  Detail::make_unique<Catch::ReporterFactory<Catch::XmlReporter>>();
  Detail::unique_ptr<Catch::ReporterRegistry::ReporterRegistryImpl>::operator->(in_RDI);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(this_02,(char *)__s,__a);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::Detail::unique_ptr<Catch::IReporterFactory>,_Catch::Detail::CaseInsensitiveLess,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::Detail::unique_ptr<Catch::IReporterFactory>_>_>_>
  ::operator[](this_00,__k);
  Detail::unique_ptr<Catch::IReporterFactory>::operator=
            (in_stack_fffffffffffffd50,
             (unique_ptr<Catch::ReporterFactory<Catch::XmlReporter>_> *)in_stack_fffffffffffffd48);
  std::__cxx11::string::~string(local_190);
  std::allocator<char>::~allocator(&local_191);
  Detail::unique_ptr<Catch::ReporterFactory<Catch::XmlReporter>_>::~unique_ptr
            ((unique_ptr<Catch::ReporterFactory<Catch::XmlReporter>_> *)in_stack_fffffffffffffd50);
  Detail::make_unique<Catch::ReporterFactory<Catch::JsonReporter>>();
  Detail::unique_ptr<Catch::ReporterRegistry::ReporterRegistryImpl>::operator->(in_RDI);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(this_02,(char *)__s,__a);
  this_01 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::Detail::unique_ptr<Catch::IReporterFactory>,_Catch::Detail::CaseInsensitiveLess,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Catch::Detail::unique_ptr<Catch::IReporterFactory>_>_>_>
            ::operator[](this_00,__k);
  Detail::unique_ptr<Catch::IReporterFactory>::operator=(this_01,in_stack_fffffffffffffd48);
  std::__cxx11::string::~string(local_1c0);
  std::allocator<char>::~allocator(&local_1c1);
  Detail::unique_ptr<Catch::ReporterFactory<Catch::JsonReporter>_>::~unique_ptr
            ((unique_ptr<Catch::ReporterFactory<Catch::JsonReporter>_> *)this_01);
  return;
}

Assistant:

ReporterRegistry::ReporterRegistry():
        m_impl( Detail::make_unique<ReporterRegistryImpl>() ) {
        // Because it is impossible to move out of initializer list,
        // we have to add the elements manually
        m_impl->factories["Automake"] =
            Detail::make_unique<ReporterFactory<AutomakeReporter>>();
        m_impl->factories["compact"] =
            Detail::make_unique<ReporterFactory<CompactReporter>>();
        m_impl->factories["console"] =
            Detail::make_unique<ReporterFactory<ConsoleReporter>>();
        m_impl->factories["JUnit"] =
            Detail::make_unique<ReporterFactory<JunitReporter>>();
        m_impl->factories["SonarQube"] =
            Detail::make_unique<ReporterFactory<SonarQubeReporter>>();
        m_impl->factories["TAP"] =
            Detail::make_unique<ReporterFactory<TAPReporter>>();
        m_impl->factories["TeamCity"] =
            Detail::make_unique<ReporterFactory<TeamCityReporter>>();
        m_impl->factories["XML"] =
            Detail::make_unique<ReporterFactory<XmlReporter>>();
        m_impl->factories["JSON"] =
            Detail::make_unique<ReporterFactory<JsonReporter>>();
    }